

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_CircularBuffer.h
# Opt level: O0

size_t __thiscall
axl::sl::CircularBufferBase<char>::dropFront(CircularBufferBase<char> *this,size_t length)

{
  char *pcVar1;
  size_t sVar2;
  ulong in_RSI;
  ArrayRef<char,_axl::sl::ArrayDetails<char>_> *in_RDI;
  size_t local_10;
  
  local_10 = in_RSI;
  if (in_RDI[1].m_count < in_RSI) {
    local_10 = in_RDI[1].m_count;
  }
  pcVar1 = in_RDI[1].m_p;
  sVar2 = ArrayRef<char,_axl::sl::ArrayDetails<char>_>::getCount(in_RDI);
  in_RDI[1].m_p = (char *)((ulong)(pcVar1 + local_10) % sVar2);
  in_RDI[1].m_count = in_RDI[1].m_count - local_10;
  return local_10;
}

Assistant:

size_t
	dropFront(size_t length) {
		if (length > m_length)
			length = m_length;

		m_front = (m_front + length) % m_buffer.getCount();
		m_length -= length;

		ASSERT(isValid());
		return length;
	}